

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_print.c
# Opt level: O0

void error(char *fmt,...)

{
  int i;
  t_int arg [8];
  va_list ap;
  char local_3f8 [8];
  char buf [1000];
  char *fmt_local;
  
  arg[7]._4_4_ = 0x30;
  arg[7]._0_4_ = 8;
  buf._992_8_ = fmt;
  vsnprintf(local_3f8,999,fmt,arg + 7);
  strcat(local_3f8,"\n");
  doerror((void *)0x0,local_3f8);
  return;
}

Assistant:

EXTERN void error(const char *fmt, ...)
{
    char buf[MAXPDSTRING];
    va_list ap;
    t_int arg[8];
    int i;

    va_start(ap, fmt);
    vsnprintf(buf, MAXPDSTRING-1, fmt, ap);
    va_end(ap);
    strcat(buf, "\n");

    doerror(NULL, buf);
}